

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O0

int uarb_cmp(uarb a,int adigits,uarb b,int bdigits)

{
  int iVar1;
  int bdigits_local;
  uarb b_local;
  int adigits_local;
  uarb a_local;
  
  if (adigits < bdigits) {
    a_local._4_4_ = -1;
  }
  else {
    b_local._4_4_ = adigits;
    if (bdigits < adigits) {
      a_local._4_4_ = 1;
    }
    else {
      do {
        iVar1 = b_local._4_4_ + -1;
        if (b_local._4_4_ < 1) {
          return 0;
        }
        if (a[iVar1] < b[iVar1]) {
          return -1;
        }
        b_local._4_4_ = iVar1;
      } while (a[iVar1] <= b[iVar1]);
      a_local._4_4_ = 1;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
uarb_cmp(uarb a, int adigits, uarb b, int bdigits)
   /* Return -1/0/+1 according as a<b/a==b/a>b */
{
   if (adigits < bdigits)
      return -1;

   if (adigits > bdigits)
      return 1;

   while (adigits-- > 0)
      if (a[adigits] < b[adigits])
         return -1;

      else if (a[adigits] > b[adigits])
         return 1;

   return 0;
}